

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O3

void __thiscall OSTEI_HRR_Writer::WriteHRR_Bra_Inline_(OSTEI_HRR_Writer *this,ostream *os,QAM *am)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  OSTEI_HRR_Algorithm_Base *this_00;
  uint uVar3;
  uint uVar4;
  HRRDoubletStepList brasteps;
  string ket_str;
  string ncart_ket_str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  HRRDoubletStepList local_c8;
  string local_b0;
  DAM local_90;
  _Type local_68;
  undefined8 uStack_60;
  string local_50;
  
  iVar2 = (am->qam)._M_elems[2];
  uVar3 = (uint)((iVar2 + 1) * (iVar2 + 2)) >> 1;
  if (iVar2 < 0) {
    uVar3 = 0;
  }
  iVar2 = (am->qam)._M_elems[3];
  uVar4 = (uint)((iVar2 + 1) * (iVar2 + 2)) >> 1;
  if (iVar2 < 0) {
    uVar4 = 0;
  }
  local_b0._M_dataplus._M_p._0_4_ = uVar4 * uVar3;
  StringBuilder<int>(&local_50,(int *)&local_b0);
  StringBuilder<char,char_const(&)[2],char_const&>
            (&local_b0,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + (am->qam)._M_elems[2],
             (char (*) [2])0x148cbc,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + (am->qam)._M_elems[3])
  ;
  this_00 = this->hrr_algo_;
  local_68 = *(_Type *)(am->qam)._M_elems;
  uStack_60 = 0;
  local_e8 = &local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
  paVar1 = &local_90.tag.field_2;
  local_90.dam._M_elems[0] = local_68[0];
  local_90.dam._M_elems[1] = local_68[1];
  if (local_e8 == &local_d8) {
    local_90.tag.field_2._8_8_ = local_d8._8_8_;
    local_90.tag._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.tag._M_dataplus._M_p = (pointer)local_e8;
  }
  local_90.tag._M_string_length = local_e0;
  local_e0 = 0;
  local_d8._M_local_buf[0] = '\0';
  local_e8 = &local_d8;
  OSTEI_HRR_Algorithm_Base::GetBraSteps(&local_c8,this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.tag._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.tag._M_dataplus._M_p);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  WriteBraSteps_(this,os,&local_c8,&am->tag,&local_50,&local_b0);
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector(&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,(int)local_b0._M_dataplus._M_p) !=
      &local_b0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_b0._M_dataplus._M_p._4_4_,(int)local_b0._M_dataplus._M_p));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR_Bra_Inline_(std::ostream & os, QAM am) const
{
    // ncart_ket in string form
    std::string ncart_ket_str = StringBuilder(NCART(am[2], am[3]));

    // the ket part in string form
    std::string ket_str = StringBuilder(amchar[am[2]], "_", amchar[am[3]]);

    // actually write out the steps now
    auto brasteps = hrr_algo_.GetBraSteps(DAM{am[0], am[1]});
    WriteBraSteps_(os, brasteps, am.tag, ncart_ket_str, ket_str);
}